

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O2

QLoggingCategory * lcGestureManager(void)

{
  QLoggingCategory *pQVar1;
  undefined4 in_EAX;
  int iVar2;
  undefined4 in_register_00000004;
  undefined8 uVar3;
  
  iVar2 = CONCAT31((int3)((uint)in_EAX >> 8),lcGestureManager()::category);
  if (lcGestureManager()::category == '\0') {
    uVar3 = __cxa_guard_acquire(&lcGestureManager()::category);
    in_register_00000004 = (undefined4)((ulong)uVar3 >> 0x20);
    iVar2 = (int)uVar3;
    if (iVar2 != 0) {
      QLoggingCategory::QLoggingCategory
                (&lcGestureManager::category,"qt.widgets.gestures",QtDebugMsg);
      __cxa_atexit(QLoggingCategory::~QLoggingCategory,&lcGestureManager::category,0x7fe000);
      pQVar1 = (QLoggingCategory *)__cxa_guard_release(&lcGestureManager()::category);
      return pQVar1;
    }
  }
  return (QLoggingCategory *)CONCAT44(in_register_00000004,iVar2);
}

Assistant:

static inline int panTouchPoints()
{
    // Override by environment variable for testing.
    static const char panTouchPointVariable[] = "QT_PAN_TOUCHPOINTS";
    if (qEnvironmentVariableIsSet(panTouchPointVariable)) {
        bool ok;
        const int result = qEnvironmentVariableIntValue(panTouchPointVariable, &ok);
        if (ok && result >= 1)
            return result;
        qWarning("Ignoring invalid value of %s", panTouchPointVariable);
    }
    // Pan should use 1 finger on a touch screen and 2 fingers on touch pads etc.
    // where 1 finger movements are used for mouse event synthetization. For now,
    // default to 2 until all classes inheriting QScrollArea are fixed to handle it
    // correctly.
    return 2;
}